

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void rgb_gray_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                     JSAMPARRAY output_buf,int num_rows)

{
  uint uVar1;
  _func_void_j_decompress_ptr *p_Var2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  JSAMPARRAY ppJVar7;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPROW outptr;
  JLONG *ctab;
  int b;
  int g;
  int r;
  my_cconvert_ptr_conflict cconvert;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  
  p_Var2 = cinfo->cconvert[3].start_pass;
  uVar1 = cinfo->output_width;
  num_rows_local = num_rows;
  output_buf_local = output_buf;
  input_row_local = input_row;
  while (num_rows_local = num_rows_local + -1, -1 < num_rows_local) {
    pJVar3 = (*input_buf)[input_row_local];
    pJVar4 = input_buf[1][input_row_local];
    pJVar5 = input_buf[2][input_row_local];
    input_row_local = input_row_local + 1;
    ppJVar7 = output_buf_local + 1;
    pJVar6 = *output_buf_local;
    for (col = 0; output_buf_local = ppJVar7, col < uVar1; col = col + 1) {
      pJVar6[col] = (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uint)pJVar3[col] * 8) +
                                      *(long *)(p_Var2 + (long)(int)(pJVar4[col] + 0x100) * 8) +
                                     *(long *)(p_Var2 + (long)(int)(pJVar5[col] + 0x200) * 8)) >>
                             0x10);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_gray_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                 JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr)cinfo->cconvert;
  register int r, g, b;
  register JLONG *ctab = cconvert->rgb_y_tab;
  register JSAMPROW outptr;
  register JSAMPROW inptr0, inptr1, inptr2;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;

  while (--num_rows >= 0) {
    inptr0 = input_buf[0][input_row];
    inptr1 = input_buf[1][input_row];
    inptr2 = input_buf[2][input_row];
    input_row++;
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      r = inptr0[col];
      g = inptr1[col];
      b = inptr2[col];
      /* Y */
      outptr[col] = (JSAMPLE)((ctab[r + R_Y_OFF] + ctab[g + G_Y_OFF] +
                               ctab[b + B_Y_OFF]) >> SCALEBITS);
    }
  }
}